

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall
QColorDialogPrivate::updateColorLabelText(QColorDialogPrivate *this,QPoint *globalPos)

{
  int fieldWidth;
  int a;
  QString *in_RSI;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QString *this_00;
  QChar local_54;
  QChar local_52 [37];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&in_RDI[0x14].super_QFrame.super_QWidget.field_0x8 != 0) {
    this_00 = *(QString **)&in_RDI[0x14].super_QFrame.super_QWidget.field_0x8;
    QColorDialog::tr((char *)this_00,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
    fieldWidth = QPoint::x((QPoint *)0x737a83);
    QChar::QChar<char16_t,_true>(local_52,L' ');
    QString::arg<int,_true>
              (this_00,in_stack_ffffffffffffff84,fieldWidth,in_stack_ffffffffffffff7c,
               (QChar)(char16_t)((ulong)in_RSI >> 0x30));
    a = QPoint::y((QPoint *)0x737ac1);
    QChar::QChar<char16_t,_true>(&local_54,L' ');
    QString::arg<int,_true>
              (this_00,a,fieldWidth,in_stack_ffffffffffffff7c,
               (QChar)(char16_t)((ulong)in_RSI >> 0x30));
    QLabel::setText(in_RDI,in_RSI);
    QString::~QString((QString *)0x737b0e);
    QString::~QString((QString *)0x737b18);
    QString::~QString((QString *)0x737b22);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::updateColorLabelText(const QPoint &globalPos)
{
    if (lblScreenColorInfo)
        lblScreenColorInfo->setText(QColorDialog::tr("Cursor at %1, %2\nPress ESC to cancel")
                                .arg(globalPos.x())
                                .arg(globalPos.y()));
}